

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O3

void __thiscall dg::pta::PointerAnalysis::enqueue(PointerAnalysis *this,PSNode *n)

{
  pointer *pppPVar1;
  iterator __position;
  PSNode *local_8;
  
  __position._M_current =
       (this->changed).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->changed).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = n;
    std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
    _M_realloc_insert<dg::pta::PSNode*const&>
              ((vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)&this->changed,
               __position,&local_8);
  }
  else {
    *__position._M_current = n;
    pppPVar1 = &(this->changed).
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppPVar1 = *pppPVar1 + 1;
  }
  return;
}

Assistant:

virtual void enqueue(PSNode *n) { changed.push_back(n); }